

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

Expression *
slang::ast::Expression::convertAssignment
          (ASTContext *context,Type *type,Expression *expr,SourceLocation location,
          Expression **lhsExpr,bitmask<slang::ast::AssignFlags> *assignFlags)

{
  byte *pbVar1;
  Scope *pSVar2;
  bool bVar3;
  bitwidth_t bVar4;
  Expression *pEVar5;
  InstanceSymbolBase *expr_00;
  Type *pTVar6;
  OpenRangeExpression *pOVar7;
  Diagnostic *diag;
  Diagnostic *diag_00;
  char *func;
  OpenRangeExpression *ore;
  ConversionExpression **expr_01;
  DiagCode code;
  Compilation *pCVar8;
  InstanceSymbolBase *instance;
  Expression *conn;
  ConversionExpression *local_58;
  Expression **local_50;
  ConversionExpression *local_48;
  Expression *local_40;
  Compilation *local_38;
  
  instance = (InstanceSymbolBase *)lhsExpr;
  bVar3 = bad(expr);
  if (bVar3) {
    return expr;
  }
  pSVar2 = (context->scope).ptr;
  local_50 = lhsExpr;
  if (pSVar2 == (Scope *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
    goto LAB_003a5c35;
  }
  pCVar8 = pSVar2->compilation;
  pTVar6 = type->canonical;
  if (pTVar6 == (Type *)0x0) {
    Type::resolveCanonical(type);
    pTVar6 = type->canonical;
  }
  if ((pTVar6->super_Symbol).kind == ErrorType) {
    pEVar5 = badExpr(pCVar8,expr);
    return pEVar5;
  }
  pTVar6 = (expr->type).ptr;
  local_58 = (ConversionExpression *)expr;
  if (pTVar6 == (Type *)0x0) {
LAB_003a5c20:
    func = "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
    ;
LAB_003a5c35:
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,func);
  }
  bVar3 = Type::isEquivalent(type,pTVar6);
  if (!bVar3) {
    local_38 = pCVar8;
    expr_00 = ASTContext::getInstance(context);
    if ((expr_00 != (InstanceSymbolBase *)0x0) && ((expr_00->arrayPath).size_ != 0)) {
      bVar4 = Type::getBitWidth(type);
      local_40 = (Expression *)CONCAT44(local_40._4_4_,bVar4);
      bVar4 = Type::getBitWidth(pTVar6);
      if (((bitwidth_t)local_40 != bVar4) ||
         (bVar3 = Type::isAssignmentCompatible(type,pTVar6), !bVar3)) {
        if (local_50 == (Expression **)0x0) {
          local_48 = (ConversionExpression *)
                     tryConnectPortArray((Expression *)context,(ASTContext *)type,(Type *)expr,
                                         (Expression *)expr_00,instance);
          if (local_48 != (ConversionExpression *)0x0) {
            expr_01 = &local_48;
            goto LAB_003a58bc;
          }
        }
        else {
          local_48 = (ConversionExpression *)
                     tryConnectPortArray((Expression *)context,(ASTContext *)pTVar6,
                                         (Type *)*local_50,(Expression *)expr_00,instance);
          if (local_48 != (ConversionExpression *)0x0) {
            selfDetermined(context,(Expression **)&local_48);
            *local_50 = &local_48->super_Expression;
            if (assignFlags == (bitmask<slang::ast::AssignFlags> *)0x0) {
              assert::assertFailed
                        ("assignFlags",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                         ,0x111,
                         "static Expression &slang::ast::Expression::convertAssignment(const ASTContext &, const Type &, Expression &, SourceLocation, Expression **, bitmask<AssignFlags> *)"
                        );
            }
            pbVar1 = (byte *)((long)&assignFlags->m_bits + 1);
            *pbVar1 = *pbVar1 | 1;
            goto LAB_003a58b7;
          }
        }
      }
    }
    bVar3 = Type::isAssignmentCompatible(type,pTVar6);
    pCVar8 = local_38;
    if (!bVar3) {
      bVar3 = isImplicitlyAssignableTo(expr,local_38,type);
      if (bVar3) goto LAB_003a5a79;
      if (expr->kind != OpenRange) {
        if (expr->kind != Streaming) {
          code.subsystem = Expressions;
          code.code = 0x1b;
          if ((((context->flags).m_bits & 0x40000000) == 0) &&
             ((bVar3 = Type::isCastCompatible(type,pTVar6), bVar3 ||
              (bVar3 = Type::isBitstreamCastable(type,pTVar6), bVar3)))) {
            code.subsystem = Expressions;
            code.code = 0x70;
          }
          diag = ASTContext::addDiag(context,code,location);
          diag_00 = ast::operator<<(diag,pTVar6);
          ast::operator<<(diag_00,type);
          if (local_50 != (Expression **)0x0) {
            Diagnostic::operator<<(diag,(*local_50)->sourceRange);
          }
          Diagnostic::operator<<(diag,expr->sourceRange);
          pCVar8 = local_38;
LAB_003a5bfc:
          pEVar5 = badExpr(pCVar8,expr);
          return pEVar5;
        }
        bVar3 = Bitstream::canBeSource
                          (type,(StreamingConcatenationExpression *)expr,location,context);
        if (!bVar3) goto LAB_003a5bfc;
        local_48 = (ConversionExpression *)CONCAT44(local_48._4_4_,2);
        local_58 = BumpAllocator::
                   emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind,slang::ast::Expression&,slang::SourceRange&>
                             (&pCVar8->super_BumpAllocator,type,(ConversionKind *)&local_48,expr,
                              &expr->sourceRange);
        expr_01 = &local_58;
        goto LAB_003a58bc;
      }
      local_40 = convertAssignment(context,type,*(Expression **)(expr + 1),location,local_50,
                                   assignFlags);
      pEVar5 = convertAssignment(context,type,(Expression *)expr[1].type.ptr,location,local_50,
                                 assignFlags);
      pTVar6 = (expr->type).ptr;
      if (pTVar6 != (Type *)0x0) {
        pOVar7 = BumpAllocator::
                 emplace<slang::ast::OpenRangeExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                           (&pCVar8->super_BumpAllocator,pTVar6,local_40,pEVar5,&expr->sourceRange);
        (pOVar7->super_Expression).syntax = expr->syntax;
        return &pOVar7->super_Expression;
      }
      goto LAB_003a5c20;
    }
    bVar3 = Type::isNumeric(type);
    pCVar8 = local_38;
    if ((!bVar3) || (bVar3 = Type::isNumeric(pTVar6), !bVar3)) {
LAB_003a5a79:
      pEVar5 = ConversionExpression::makeImplicit(context,type,Implicit,expr,location);
      return pEVar5;
    }
    if ((((context->flags).m_bits & 8) != 0) &&
       (bVar3 = anon_unknown.dwarf_11b333a::checkEnumInitializer(context,type,expr), !bVar3))
    goto LAB_003a5bfc;
    pTVar6 = binaryOperatorType(pCVar8,type,pTVar6,false,true);
    bVar3 = Type::isEquivalent(type,pTVar6);
    if (bVar3) {
      pTVar6 = type;
    }
    contextDetermined(context,(Expression **)&local_58,pTVar6,location);
    if (bVar3) {
      return &local_58->super_Expression;
    }
    expr = &local_58->super_Expression;
    if (((context->flags).m_bits & 8) == 0) goto LAB_003a5a79;
  }
LAB_003a58b7:
  expr_01 = &local_58;
LAB_003a58bc:
  selfDetermined(context,(Expression **)expr_01);
  return &(*expr_01)->super_Expression;
}

Assistant:

Expression& Expression::convertAssignment(const ASTContext& context, const Type& type,
                                          Expression& expr, SourceLocation location,
                                          Expression** lhsExpr, bitmask<AssignFlags>* assignFlags) {
    if (expr.bad())
        return expr;

    Compilation& comp = context.getCompilation();
    if (type.isError())
        return badExpr(comp, &expr);

    Expression* result = &expr;
    const Type* rt = expr.type;
    if (type.isEquivalent(*rt)) {
        selfDetermined(context, result);
        return *result;
    }

    // If this is a port connection to an array of instances, check if the provided
    // expression represents an array that should be sliced on a per-instance basis.
    auto instance = context.getInstance();
    if (instance && !instance->arrayPath.empty()) {
        // If the connection is already of the right size and simply differs in
        // terms of four-statedness or signedness, don't bother trying to slice
        // out the connection.
        if (type.getBitWidth() != rt->getBitWidth() || !type.isAssignmentCompatible(*rt)) {
            // If we have an lhsExpr here, this is an output (or inout) port being connected.
            // We need to pass the lhs in as the expression to be connected, since we can't
            // slice the port side. If lhsExpr is null, this is an input port and we should
            // slice the incoming expression as an rvalue.
            if (lhsExpr) {
                Expression* conn = tryConnectPortArray(context, *rt, **lhsExpr, *instance);
                if (conn) {
                    selfDetermined(context, conn);
                    *lhsExpr = conn;

                    ASSERT(assignFlags);
                    if (assignFlags)
                        *assignFlags |= AssignFlags::SlicedPort;

                    selfDetermined(context, result);
                    return *result;
                }
            }
            else {
                Expression* conn = tryConnectPortArray(context, type, expr, *instance);
                if (conn) {
                    selfDetermined(context, conn);
                    return *conn;
                }
            }
        }
    }

    if (!type.isAssignmentCompatible(*rt)) {
        if (expr.isImplicitlyAssignableTo(comp, type)) {
            return ConversionExpression::makeImplicit(context, type, ConversionKind::Implicit,
                                                      *result, location);
        }

        if (expr.kind == ExpressionKind::Streaming) {
            if (Bitstream::canBeSource(type, expr.as<StreamingConcatenationExpression>(), location,
                                       context)) {
                // Add an implicit bit-stream casting otherwise types are not assignment compatible.
                // The size rule is not identical to explicit bit-stream casting so a different
                // ConversionKind is used.
                result = comp.emplace<ConversionExpression>(type, ConversionKind::StreamingConcat,
                                                            *result, result->sourceRange);
                selfDetermined(context, result);
                return *result;
            }
            return badExpr(comp, &expr);
        }
        else if (expr.kind == ExpressionKind::OpenRange) {
            // Convert each side of the range and return that as a new range.
            auto& ore = expr.as<OpenRangeExpression>();
            auto& left = convertAssignment(context, type, ore.left(), location, lhsExpr,
                                           assignFlags);
            auto& right = convertAssignment(context, type, ore.right(), location, lhsExpr,
                                            assignFlags);

            result = comp.emplace<OpenRangeExpression>(*expr.type, left, right, expr.sourceRange);
            result->syntax = expr.syntax;
            return *result;
        }

        DiagCode code = diag::BadAssignment;
        if (!context.flags.has(ASTFlags::OutputArg) &&
            (type.isCastCompatible(*rt) || type.isBitstreamCastable(*rt))) {
            code = diag::NoImplicitConversion;
        }

        auto& diag = context.addDiag(code, location);
        diag << *rt << type;
        if (lhsExpr)
            diag << (*lhsExpr)->sourceRange;

        diag << expr.sourceRange;
        return badExpr(comp, &expr);
    }

    if (type.isNumeric() && rt->isNumeric()) {
        if (context.flags.has(ASTFlags::EnumInitializer) &&
            !checkEnumInitializer(context, type, *result)) {
            return badExpr(comp, &expr);
        }

        // The "signednessFromRt" flag is important here; only the width of the lhs is
        // propagated down to operands, not the sign flag. Once the expression is appropriately
        // sized, the makeImplicit call down below will convert the sign for us.
        rt = binaryOperatorType(comp, &type, rt, false, /* signednessFromRt */ true);
        bool expanding = type.isEquivalent(*rt);
        if (expanding)
            rt = &type;

        contextDetermined(context, result, *rt, location);
        if (expanding)
            return *result;

        // Do not convert (truncate) enum initializer so out of range value can be checked.
        if (context.flags.has(ASTFlags::EnumInitializer)) {
            selfDetermined(context, result);
            return *result;
        }
    }

    return ConversionExpression::makeImplicit(context, type, ConversionKind::Implicit, *result,
                                              location);
}